

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

void __thiscall
kj::anon_unknown_36::NetworkAddressHttpClient::RefcountedClient::~RefcountedClient
          (RefcountedClient *this)

{
  NetworkAddressHttpClient *pNVar1;
  Disposer *pDVar2;
  PromiseArenaMember *node;
  _Map_pointer __src;
  ulong uVar3;
  int iVar4;
  undefined4 extraout_var;
  long lVar5;
  _Map_pointer ppAVar6;
  AvailableClient *pAVar7;
  size_t sVar8;
  long lVar9;
  _Map_pointer __dest;
  _Map_pointer ppAVar10;
  _Elt_pointer pAVar11;
  long lVar12;
  Exception *exception;
  HttpClientImpl *pHVar13;
  NetworkAddressHttpClient local_4f8 [6];
  
  pNVar1 = this->parent;
  pNVar1->activeConnectionCount = pNVar1->activeConnectionCount - 1;
  pDVar2 = (this->client).disposer;
  pHVar13 = (this->client).ptr;
  (this->client).ptr = (HttpClientImpl *)0x0;
  if (((((pHVar13->upgraded != false) || (pHVar13->closed != false)) ||
       ((pHVar13->httpInput).broken != false)) ||
      (((pHVar13->httpInput).pendingMessageCount != 0 || ((pHVar13->httpOutput).inBody != false))))
     || (((pHVar13->httpOutput).broken != false ||
         (((pHVar13->httpOutput).writeInProgress != false ||
          ((pNVar1->settings).idleTimeout.value < 1)))))) goto LAB_0040da51;
  iVar4 = (**(pNVar1->timer->super_MonotonicClock)._vptr_MonotonicClock)();
  lVar5 = CONCAT44(extraout_var,iVar4) + (pNVar1->settings).idleTimeout.value;
  pAVar11 = (pNVar1->availableClients).
            super__Deque_base<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient,_std::allocator<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pAVar11 ==
      (pNVar1->availableClients).
      super__Deque_base<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient,_std::allocator<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    ppAVar10 = (pNVar1->availableClients).
               super__Deque_base<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient,_std::allocator<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node;
    __src = (pNVar1->availableClients).
            super__Deque_base<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient,_std::allocator<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient>_>
            ._M_impl.super__Deque_impl_data._M_start._M_node;
    lVar9 = (long)ppAVar10 - (long)__src >> 3;
    if (((long)(pNVar1->availableClients).
               super__Deque_base<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient,_std::allocator<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient>_>
               ._M_impl.super__Deque_impl_data._M_start._M_last -
         (long)(pNVar1->availableClients).
               super__Deque_base<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient,_std::allocator<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient>_>
               ._M_impl.super__Deque_impl_data._M_start._M_cur >> 3) * -0x5555555555555555 +
        ((long)pAVar11 -
         (long)(pNVar1->availableClients).
               super__Deque_base<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient,_std::allocator<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) * -0x5555555555555555 +
        (lVar9 + -1 + (ulong)(ppAVar10 == (_Map_pointer)0x0)) * 0x15 == 0xaaaaaaaaaaaaaaa) {
      std::__throw_length_error("cannot create std::deque larger than max_size()");
    }
    ppAVar6 = (pNVar1->availableClients).
              super__Deque_base<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient,_std::allocator<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient>_>
              ._M_impl.super__Deque_impl_data._M_map;
    uVar3 = (pNVar1->availableClients).
            super__Deque_base<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient,_std::allocator<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient>_>
            ._M_impl.super__Deque_impl_data._M_map_size;
    if (uVar3 - ((long)ppAVar10 - (long)ppAVar6 >> 3) < 2) {
      if (lVar9 * 2 + 4U < uVar3) {
        __dest = (_Map_pointer)((long)ppAVar6 + (uVar3 - (lVar9 + 2) & 0xfffffffffffffffe) * 4);
        if (__dest < __src) {
          sVar8 = (long)ppAVar10 + (8 - (long)__src);
          ppAVar10 = __dest;
          if (sVar8 != 0) {
LAB_0040dcf2:
            memmove(ppAVar10,__src,sVar8);
          }
        }
        else {
          sVar8 = (long)ppAVar10 + (8 - (long)__src);
          if (sVar8 != 0) {
            ppAVar10 = (_Map_pointer)((long)__dest + ((lVar9 + 1) * 8 - sVar8));
            goto LAB_0040dcf2;
          }
        }
      }
      else {
        lVar12 = uVar3 * 2 + (ulong)(uVar3 == 0);
        uVar3 = lVar12 + 2;
        if (uVar3 >> 0x3c != 0) {
          if (uVar3 >> 0x3d != 0) {
            std::__throw_bad_array_new_length();
          }
          std::__throw_bad_alloc();
        }
        ppAVar6 = (_Map_pointer)operator_new(uVar3 * 8);
        __dest = (_Map_pointer)((long)ppAVar6 + (lVar12 - lVar9 & 0xfffffffffffffffeU) * 4);
        ppAVar10 = (pNVar1->availableClients).
                   super__Deque_base<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient,_std::allocator<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_node;
        sVar8 = (long)(pNVar1->availableClients).
                      super__Deque_base<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient,_std::allocator<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_node + (8 - (long)ppAVar10);
        if (sVar8 != 0) {
          memmove(__dest,ppAVar10,sVar8);
        }
        operator_delete((pNVar1->availableClients).
                        super__Deque_base<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient,_std::allocator<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient>_>
                        ._M_impl.super__Deque_impl_data._M_map,
                        (pNVar1->availableClients).
                        super__Deque_base<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient,_std::allocator<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient>_>
                        ._M_impl.super__Deque_impl_data._M_map_size << 3);
        (pNVar1->availableClients).
        super__Deque_base<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient,_std::allocator<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient>_>
        ._M_impl.super__Deque_impl_data._M_map = ppAVar6;
        (pNVar1->availableClients).
        super__Deque_base<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient,_std::allocator<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient>_>
        ._M_impl.super__Deque_impl_data._M_map_size = uVar3;
      }
      (pNVar1->availableClients).
      super__Deque_base<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient,_std::allocator<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient>_>
      ._M_impl.super__Deque_impl_data._M_start._M_node = __dest;
      pAVar7 = *__dest;
      (pNVar1->availableClients).
      super__Deque_base<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient,_std::allocator<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient>_>
      ._M_impl.super__Deque_impl_data._M_start._M_first = pAVar7;
      (pNVar1->availableClients).
      super__Deque_base<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient,_std::allocator<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient>_>
      ._M_impl.super__Deque_impl_data._M_start._M_last = pAVar7 + 0x15;
      (pNVar1->availableClients).
      super__Deque_base<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient,_std::allocator<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_node = __dest + lVar9;
      pAVar7 = __dest[lVar9];
      (pNVar1->availableClients).
      super__Deque_base<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient,_std::allocator<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_first = pAVar7;
      (pNVar1->availableClients).
      super__Deque_base<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient,_std::allocator<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_last = pAVar7 + 0x15;
    }
    pAVar7 = (AvailableClient *)operator_new(0x1f8);
    (pNVar1->availableClients).
    super__Deque_base<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient,_std::allocator<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient>_>
    ._M_impl.super__Deque_impl_data._M_finish._M_node[1] = pAVar7;
    pAVar11 = (pNVar1->availableClients).
              super__Deque_base<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient,_std::allocator<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    (pAVar11->client).disposer = pDVar2;
    (pAVar11->client).ptr = pHVar13;
    (pAVar11->expires).value.value = lVar5;
    ppAVar10 = (pNVar1->availableClients).
               super__Deque_base<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient,_std::allocator<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node;
    (pNVar1->availableClients).
    super__Deque_base<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient,_std::allocator<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient>_>
    ._M_impl.super__Deque_impl_data._M_finish._M_node = ppAVar10 + 1;
    pAVar11 = ppAVar10[1];
    (pNVar1->availableClients).
    super__Deque_base<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient,_std::allocator<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient>_>
    ._M_impl.super__Deque_impl_data._M_finish._M_first = pAVar11;
    (pNVar1->availableClients).
    super__Deque_base<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient,_std::allocator<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient>_>
    ._M_impl.super__Deque_impl_data._M_finish._M_last = pAVar11 + 0x15;
  }
  else {
    (pAVar11->client).disposer = pDVar2;
    (pAVar11->client).ptr = pHVar13;
    (pAVar11->expires).value.value = lVar5;
    pAVar11 = pAVar11 + 1;
  }
  (pNVar1->availableClients).
  super__Deque_base<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient,_std::allocator<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = pAVar11;
  pHVar13 = (HttpClientImpl *)0x0;
LAB_0040da51:
  if (pNVar1->timeoutsScheduled == false) {
    pNVar1->timeoutsScheduled = true;
    applyTimeouts(local_4f8);
    node = &((pNVar1->timeoutTask).super_PromiseBase.node.ptr)->super_PromiseArenaMember;
    (pNVar1->timeoutTask).super_PromiseBase.node.ptr =
         (PromiseNode *)local_4f8[0].super_HttpClient._vptr_HttpClient;
    if (node != (PromiseArenaMember *)0x0) {
      kj::_::PromiseDisposer::dispose(node);
    }
  }
  if (pHVar13 != (HttpClientImpl *)0x0) {
    (**pDVar2->_vptr_Disposer)
              (pDVar2,(_func_int *)
                      ((long)&(pHVar13->super_HttpClient)._vptr_HttpClient +
                      (long)(pHVar13->super_HttpClient)._vptr_HttpClient[-2]));
  }
  pHVar13 = (this->client).ptr;
  if (pHVar13 != (HttpClientImpl *)0x0) {
    (this->client).ptr = (HttpClientImpl *)0x0;
    pDVar2 = (this->client).disposer;
    (**pDVar2->_vptr_Disposer)
              (pDVar2,(_func_int *)
                      ((long)&(pHVar13->super_HttpClient)._vptr_HttpClient +
                      (long)(pHVar13->super_HttpClient)._vptr_HttpClient[-2]));
  }
  Refcounted::~Refcounted(&this->super_Refcounted);
  return;
}

Assistant:

~RefcountedClient() noexcept(false) {
      --parent.activeConnectionCount;
      KJ_IF_SOME(exception, kj::runCatchingExceptions([&]() {
        parent.returnClientToAvailable(kj::mv(client));
      })) {
        KJ_LOG(ERROR, exception);
      }
    }